

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O2

void __thiscall AActor::CheckSectorTransition(AActor *this,sector_t *oldsec)

{
  double dVar1;
  sector_t *psVar2;
  ASectorAction *pAVar3;
  uint activationType;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  
  if (this->Sector != oldsec) {
    pAVar3 = GC::ReadBarrier<ASectorAction>((ASectorAction **)&oldsec->SecActTarget);
    if (pAVar3 != (ASectorAction *)0x0) {
      pAVar3 = GC::ReadBarrier<ASectorAction>((ASectorAction **)&oldsec->SecActTarget);
      ASectorAction::TriggerAction(pAVar3,this,2);
    }
    pAVar3 = GC::ReadBarrier<ASectorAction>((ASectorAction **)&this->Sector->SecActTarget);
    if (pAVar3 != (ASectorAction *)0x0) {
      dVar7 = (this->__Pos).Z;
      dVar4 = secplane_t::ZatPoint(&this->Sector->floorplane,this);
      dVar6 = (this->__Pos).Z;
      dVar1 = this->Height;
      dVar5 = secplane_t::ZatPoint(&this->Sector->ceilingplane,this);
      activationType = (uint)(dVar7 <= dVar4) * 4 + (uint)(dVar5 <= dVar6 + dVar1) * 8 + 1;
      psVar2 = this->Sector->heightsec;
      if (psVar2 != (sector_t *)0x0) {
        dVar7 = (this->__Pos).Z;
        dVar6 = secplane_t::ZatPoint(&psVar2->floorplane,this);
        if ((dVar7 == dVar6) && (!NAN(dVar7) && !NAN(dVar6))) {
          activationType = activationType | 0x400;
        }
      }
      pAVar3 = GC::ReadBarrier<ASectorAction>((ASectorAction **)&this->Sector->SecActTarget);
      ASectorAction::TriggerAction(pAVar3,this,activationType);
    }
    dVar7 = (this->__Pos).Z;
    if ((dVar7 == this->floorz) && (!NAN(dVar7) && !NAN(this->floorz))) {
      P_CheckFor3DFloorHit(this,dVar7);
      dVar7 = (this->__Pos).Z;
    }
    dVar7 = dVar7 + this->Height;
    if ((dVar7 == this->ceilingz) && (!NAN(dVar7) && !NAN(this->ceilingz))) {
      P_CheckFor3DCeilingHit(this,dVar7);
      return;
    }
  }
  return;
}

Assistant:

void AActor::CheckSectorTransition(sector_t *oldsec)
{
	if (oldsec != Sector)
	{
		if (oldsec->SecActTarget != NULL)
		{
			oldsec->SecActTarget->TriggerAction(this, SECSPAC_Exit);
		}
		if (Sector->SecActTarget != NULL)
		{
			int act = SECSPAC_Enter;
			if (Z() <= Sector->floorplane.ZatPoint(this))
			{
				act |= SECSPAC_HitFloor;
			}
			if (Top() >= Sector->ceilingplane.ZatPoint(this))
			{
				act |= SECSPAC_HitCeiling;
			}
			if (Sector->heightsec != NULL && Z() == Sector->heightsec->floorplane.ZatPoint(this))
			{
				act |= SECSPAC_HitFakeFloor;
			}
			Sector->SecActTarget->TriggerAction(this, act);
		}
		if (Z() == floorz)
		{
			P_CheckFor3DFloorHit(this, Z());
		}
		if (Top() == ceilingz)
		{
			P_CheckFor3DCeilingHit(this, Top());
		}
	}
}